

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O3

Integer MA_inquire_stack_no_partition(Integer datatype)

{
  Integer IVar1;
  ErrorLevel elevel;
  
  ma_stats.calls[0x13] = ma_stats.calls[0x13] + 1;
  if (ma_initialized == '\0') {
    builtin_strncpy(ma_ebuf,"MA not yet initialized",0x17);
    elevel = EL_Nonfatal;
  }
  else {
    if (datatype - 1000U < 0x11) {
      if ((long)ma_sp - (long)ma_hp == 0) {
        return 0;
      }
      IVar1 = ma_nelem(ma_hp,(long)ma_sp - (long)ma_hp,datatype - 1000U);
      return IVar1;
    }
    sprintf(ma_ebuf,"invalid datatype: %ld",datatype);
    elevel = EL_Fatal;
  }
  ma_error(elevel,ET_External,"MA_inquire_stack_no_partition",ma_ebuf);
  return 0;
}

Assistant:

public Integer MA_inquire_stack_no_partition(Integer datatype)
{
    size_t    gap_length;    /* # of bytes between heap and partition */
    Integer    nelem_gap;    /* max elements containable in gap */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_inquire_stack_no_partition]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return DONTCARE;
#endif /* VERIFY */

    /* verify initialization */
    if (!ma_initialized)
    {
        (void)sprintf(ma_ebuf,
            "MA not yet initialized");
        ma_error(EL_Nonfatal, ET_External, "MA_inquire_stack_no_partition", ma_ebuf);
        return (Integer)0;
    }

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "invalid datatype: %ld",
            (size_t)datatype);
        ma_error(EL_Fatal, ET_External, "MA_inquire_stack_no_partition", ma_ebuf);
        return DONTCARE;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    /*
     * compute the # of elements for which space is available
     */

    /* try space between heap and stack */
    gap_length = (size_t)(ma_sp - ma_hp);
    /*if (ma_sp > ma_hp)*/
    if (gap_length > 0)
        nelem_gap = ma_nelem(ma_hp, (ulongi)gap_length, datatype);
    else
        nelem_gap = 0;

    /* success */
    return nelem_gap;
}